

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O1

Mux_Man_t * Mux_ManAlloc(Gia_Man_t *pGia)

{
  Mux_Man_t *pMVar1;
  Abc_Nam_t *pAVar2;
  Vec_Wec_t *p;
  Vec_Int_t *pVVar3;
  
  pMVar1 = (Mux_Man_t *)calloc(1,0x18);
  pMVar1->pGia = pGia;
  pAVar2 = Abc_NamStart(10000,0x32);
  pMVar1->pNames = pAVar2;
  p = (Vec_Wec_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  pVVar3 = (Vec_Int_t *)calloc(1000,0x10);
  p->pArray = pVVar3;
  pMVar1->vTops = p;
  Vec_WecPushLevel(p);
  return pMVar1;
}

Assistant:

Mux_Man_t * Mux_ManAlloc( Gia_Man_t * pGia )
{
    Mux_Man_t * p;
    p = ABC_CALLOC( Mux_Man_t, 1 );
    p->pGia   = pGia;
    p->pNames = Abc_NamStart( 10000, 50 );
    p->vTops  = Vec_WecAlloc( 1000 );
    Vec_WecPushLevel( p->vTops );
    return p;
}